

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseInlineExports(WastParser *this,ModuleFieldList *fields,ExternalKind kind)

{
  ModuleField *pMVar1;
  ModuleField *pMVar2;
  bool bVar3;
  Result RVar4;
  ModuleFieldList *pMVar5;
  ModuleField *local_a0;
  Location local_98;
  Token local_70;
  
  bVar3 = PeekMatchLpar(this,Export);
  if (bVar3) {
    do {
      RVar4 = Expect(this,Lpar);
      if (RVar4.enum_ == Error) {
        return (Result)Error;
      }
      GetToken(&local_70,this);
      local_98.field_1.field_1.offset = local_70.loc.field_1.field_1.offset;
      local_98.field_1._8_8_ = local_70.loc.field_1._8_8_;
      local_98.filename.data_ = local_70.loc.filename.data_;
      local_98.filename.size_ = local_70.loc.filename.size_;
      MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_a0,&local_98);
      *(ExternalKind *)&local_a0[1].loc.filename.size_ = kind;
      RVar4 = Expect(this,Export);
      if (((RVar4.enum_ == Error) ||
          (RVar4 = ParseQuotedText(this,(string *)(local_a0 + 1)), RVar4.enum_ == Error)) ||
         (RVar4 = Expect(this,Rpar), pMVar2 = local_a0, RVar4.enum_ == Error)) {
        if (local_a0 == (ModuleField *)0x0) {
          return (Result)Error;
        }
        (*local_a0->_vptr_ModuleField[1])(local_a0);
        return (Result)Error;
      }
      local_a0 = (ModuleField *)0x0;
      if (((pMVar2->super_intrusive_list_base<wabt::ModuleField>).prev_ != (ModuleField *)0x0) ||
         ((pMVar2->super_intrusive_list_base<wabt::ModuleField>).next_ != (ModuleField *)0x0)) {
        __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                      ,0x1bf,
                      "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
                     );
      }
      pMVar1 = fields->last_;
      pMVar5 = fields;
      if (pMVar1 != (ModuleField *)0x0) {
        (pMVar2->super_intrusive_list_base<wabt::ModuleField>).prev_ = pMVar1;
        pMVar5 = (ModuleFieldList *)&pMVar1->super_intrusive_list_base<wabt::ModuleField>;
      }
      pMVar5->first_ = pMVar2;
      fields->last_ = pMVar2;
      fields->size_ = fields->size_ + 1;
      bVar3 = PeekMatchLpar(this,Export);
    } while (bVar3);
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseInlineExports(ModuleFieldList* fields,
                                      ExternalKind kind) {
  WABT_TRACE(ParseInlineExports);
  while (PeekMatchLpar(TokenType::Export)) {
    EXPECT(Lpar);
    auto field = MakeUnique<ExportModuleField>(GetLocation());
    field->export_.kind = kind;
    EXPECT(Export);
    CHECK_RESULT(ParseQuotedText(&field->export_.name));
    EXPECT(Rpar);
    fields->push_back(std::move(field));
  }
  return Result::Ok;
}